

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O0

char * strchrrep(char *haystack,char needle,char replacement)

{
  code *pcVar1;
  size_t sVar2;
  char in_DL;
  char in_SIL;
  char *in_RDI;
  bool bVar3;
  int length;
  char *c;
  int local_24;
  char *local_20;
  
  if (in_RDI != (char *)0x0) {
    sVar2 = strlen(in_RDI);
    local_24 = (int)sVar2;
    local_20 = in_RDI;
    while (local_24 != 0) {
      if (*local_20 == in_SIL) {
        *local_20 = in_DL;
      }
      bVar3 = SBORROW4(local_24,1);
      local_24 = local_24 + -1;
      if (bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      local_20 = local_20 + 1;
    }
  }
  return in_RDI;
}

Assistant:

char * strchrrep(char * haystack, char needle, char replacement)
{
	char *  c=0;
	int     length=0;

	if(!haystack)
		return haystack;

	for(c=haystack,length=strlen(haystack);length;length--,c++)
	{
		if(*c==needle)
			*c = replacement;
	}

	return haystack;
}